

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathRandom.h
# Opt level: O2

Vec3<float> __thiscall
Imath_2_5::solidSphereRand<Imath_2_5::Vec3<float>,Imath_2_5::Rand32>(Imath_2_5 *this,Rand32 *rand)

{
  uint i;
  long lVar1;
  float fVar2;
  undefined4 extraout_XMM0_Db;
  float in_XMM1_Da;
  Vec3<float> VVar3;
  
  lVar1 = 0;
  do {
    for (; lVar1 != 3; lVar1 = lVar1 + 1) {
      fVar2 = (float)Imath_2_5::Rand32::nextf();
      in_XMM1_Da = 1.0 - fVar2;
      *(float *)(this + lVar1 * 4) = fVar2 - in_XMM1_Da;
    }
    VVar3.x = Vec3<float>::length2((Vec3<float> *)this);
    VVar3.y = (float)extraout_XMM0_Db;
    lVar1 = 0;
  } while (1.0 < VVar3.x);
  VVar3.z = in_XMM1_Da;
  return VVar3;
}

Assistant:

Vec
solidSphereRand (Rand &rand)
{
    Vec v;

    do
    {
	for (unsigned int i = 0; i < Vec::dimensions(); i++)
	    v[i] = (typename Vec::BaseType) rand.nextf (-1, 1);
    }
    while (v.length2() > 1);

    return v;
}